

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

int __thiscall
gl3cts::TransformFeedbackOverflowQueryStateUpdate::init
          (TransformFeedbackOverflowQueryStateUpdate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TransformFeedbackOverflowQueryStateUpdate *this_local;
  
  TransformFeedbackOverflowQueryBaseTest::init((TransformFeedbackOverflowQueryBaseTest *)this,ctx);
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryContextStateBase).
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6e0))(1,&this->m_overflow_query);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6e0))(1,&this->m_stream_overflow_query);
  return iVar1;
}

Assistant:

virtual void init()
	{
		TransformFeedbackOverflowQueryContextStateBase::init();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.genQueries(1, &m_overflow_query);
		gl.genQueries(1, &m_stream_overflow_query);
	}